

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CoverpointSymbol::serializeTo(CoverpointSymbol *this,ASTSerializer *serializer)

{
  Expression *__n;
  long lVar1;
  CoverageOptionSetter *opt;
  pointer this_00;
  string_view name;
  
  if ((this->options)._M_extent._M_extent_value != 0) {
    name._M_str = "options";
    name._M_len = 7;
    ASTSerializer::startArray(serializer,name);
    this_00 = (this->options)._M_ptr;
    for (lVar1 = (this->options)._M_extent._M_extent_value * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18
        ) {
      ASTSerializer::startObject(serializer);
      CoverageOptionSetter::serializeTo(this_00,serializer);
      ASTSerializer::endObject(serializer);
      this_00 = this_00 + 1;
    }
    ASTSerializer::endArray(serializer);
  }
  __n = getIffExpr(this);
  if (__n != (Expression *)0x0) {
    ASTSerializer::write(serializer,3,"iff",(size_t)__n);
    return;
  }
  return;
}

Assistant:

void CoverpointSymbol::serializeTo(ASTSerializer& serializer) const {
    if (!options.empty()) {
        serializer.startArray("options");
        for (auto& opt : options) {
            serializer.startObject();
            opt.serializeTo(serializer);
            serializer.endObject();
        }
        serializer.endArray();
    }

    if (auto iff = getIffExpr())
        serializer.write("iff", *iff);
}